

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereRightJoinLoop(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int p2;
  Parse *pParse;
  SrcList *pSVar4;
  Vdbe *p;
  WhereRightJoin *pWVar5;
  WhereLoop *pWVar6;
  ulong uVar7;
  WhereTerm *pWVar8;
  Table *pTab;
  Index *pIVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  Expr *pEVar13;
  Expr *pLeft;
  WhereInfo *pWInfo_00;
  Op *pOVar14;
  SrcItem *pSVar15;
  SrcItem *pSVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  uint local_d4;
  SrcList sFrom;
  
  bVar20 = 0;
  pParse = pWInfo->pParse;
  pSVar4 = pWInfo->pTabList;
  p = pParse->pVdbe;
  pWVar5 = pLevel->pRJ;
  pWVar6 = pLevel->pWLoop;
  bVar1 = pLevel->iFrom;
  uVar17 = 0;
  sqlite3VdbeExplain(pParse,'\x01',"RIGHT-JOIN %s");
  if (0 < iLevel) {
    lVar18 = 0;
    uVar17 = 0;
    do {
      uVar17 = uVar17 | *(ulong *)(*(long *)((long)&pWInfo->a[0].pWLoop + lVar18) + 8);
      sqlite3VdbeAddOp3(p,0x88,*(int *)((long)&pWInfo->a[0].iTabCur + lVar18),0,0);
      iVar12 = *(int *)((long)&pWInfo->a[0].iIdxCur + lVar18);
      if (iVar12 != 0) {
        sqlite3VdbeAddOp3(p,0x88,iVar12,0,0);
      }
      lVar18 = lVar18 + 0x70;
    } while ((ulong)(uint)iLevel * 0x70 - lVar18 != 0);
  }
  if (((pSVar4->a[bVar1].fg.jointype & 0x40) == 0) && (0 < (pWInfo->sWC).nTerm)) {
    uVar7 = pWVar6->maskSelf;
    lVar19 = 0;
    lVar18 = 0;
    pLeft = (Expr *)0x0;
    do {
      pWVar8 = (pWInfo->sWC).a;
      if (((*(ushort *)((long)&pWVar8->wtFlags + lVar19) & 0x8002) == 0) ||
         (bVar10 = true, *(short *)((long)&pWVar8->eOperator + lVar19) == 0x2000)) {
        if (((*(ulong *)((long)&pWVar8->prereqAll + lVar19) & ~(uVar17 | uVar7)) == 0) &&
           (pEVar13 = *(Expr **)((long)&pWVar8->pExpr + lVar19), (pEVar13->flags & 3) == 0)) {
          if (pEVar13 == (Expr *)0x0) {
            pEVar13 = (Expr *)0x0;
          }
          else {
            pEVar13 = exprDup(pParse->db,pEVar13,0,(u8 **)0x0);
          }
          pLeft = sqlite3ExprAnd(pParse,pLeft,pEVar13);
        }
        bVar10 = false;
      }
      if (bVar10) break;
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x38;
    } while (lVar18 < (pWInfo->sWC).nTerm);
  }
  else {
    pLeft = (Expr *)0x0;
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  pSVar15 = pSVar4->a + bVar1;
  pSVar16 = sFrom.a;
  for (lVar18 = 0xd; lVar18 != 0; lVar18 = lVar18 + -1) {
    pSVar16->pSchema = pSVar15->pSchema;
    pSVar15 = (SrcItem *)((long)pSVar15 + ((ulong)bVar20 * -2 + 1) * 8);
    pSVar16 = (SrcItem *)((long)pSVar16 + (ulong)bVar20 * -0x10 + 8);
  }
  sFrom.a[0].fg.jointype = '\0';
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + '\x01';
  pWInfo_00 = sqlite3WhereBegin(pParse,&sFrom,pLeft,(ExprList *)0x0,(ExprList *)0x0,(Select *)0x0,
                                0x1000,0);
  if (pWInfo_00 != (WhereInfo *)0x0) {
    iVar11 = pLevel->iTabCur;
    iVar3 = pParse->nMem;
    iVar12 = iVar3 + 1;
    pParse->nMem = iVar12;
    p2 = pWInfo_00->iContinue;
    pTab = pSVar4->a[bVar1].pTab;
    if ((pTab->tabFlags & 0x80) == 0) {
      sqlite3ExprCodeGetColumnOfTable(p,pTab,iVar11,-1,iVar12);
      local_d4 = 1;
    }
    else {
      for (pIVar9 = pTab->pIndex;
          (pIVar9 != (Index *)0x0 && ((*(ushort *)&pIVar9->field_0x63 & 3) != 2));
          pIVar9 = pIVar9->pNext) {
      }
      uVar2 = pIVar9->nKeyCol;
      pParse->nMem = iVar3 + (uint)uVar2;
      local_d4 = (uint)uVar2;
      if (uVar2 != 0) {
        uVar17 = 0;
        do {
          sqlite3ExprCodeGetColumnOfTable
                    (p,pTab,iVar11,(int)pIVar9->aiColumn[uVar17],(int)uVar17 + iVar12);
          uVar17 = uVar17 + 1;
        } while (local_d4 != uVar17);
      }
    }
    iVar11 = sqlite3VdbeAddOp3(p,0x3f,pWVar5->regBloom,0,iVar12);
    if (p->db->mallocFailed == '\0') {
      pOVar14 = p->aOp;
      pOVar14[iVar11].p4type = -3;
      pOVar14[iVar11].p4.i = local_d4;
    }
    iVar12 = sqlite3VdbeAddOp3(p,0x1c,pWVar5->iMatch,p2,iVar12);
    if (p->db->mallocFailed == '\0') {
      pOVar14 = p->aOp;
      pOVar14[iVar12].p4type = -3;
      pOVar14[iVar12].p4.i = local_d4;
    }
    if (p->db->mallocFailed == '\0') {
      iVar12 = p->nOp + -1;
      if (-1 < iVar11) {
        iVar12 = iVar11;
      }
      pOVar14 = p->aOp + iVar12;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar14->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,9,pWVar5->regReturn,pWVar5->addrSubrtn,0);
    sqlite3WhereEnd(pWInfo_00);
  }
  if (pLeft != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,pLeft);
  }
  sqlite3VdbeExplainPop(pParse);
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + 0xff;
  return;
}

Assistant:

void sqlite3WhereRightJoinLoop(
  WhereInfo *pWInfo,
  int iLevel,
  WhereLevel *pLevel
){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  WhereRightJoin *pRJ = pLevel->pRJ;
  Expr *pSubWhere = 0;
  WhereClause *pWC = &pWInfo->sWC;
  WhereInfo *pSubWInfo;
  WhereLoop *pLoop = pLevel->pWLoop;
  SrcItem *pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
  SrcList sFrom;
  Bitmask mAll = 0;
  int k;

  ExplainQueryPlan((pParse, 1, "RIGHT-JOIN %s", pTabItem->pTab->zName));
  sqlite3VdbeNoJumpsOutsideSubrtn(v, pRJ->addrSubrtn, pRJ->endSubrtn,
                                  pRJ->regReturn);
  for(k=0; k<iLevel; k++){
    int iIdxCur;
    mAll |= pWInfo->a[k].pWLoop->maskSelf;
    sqlite3VdbeAddOp1(v, OP_NullRow, pWInfo->a[k].iTabCur);
    iIdxCur = pWInfo->a[k].iIdxCur;
    if( iIdxCur ){
      sqlite3VdbeAddOp1(v, OP_NullRow, iIdxCur);
    }
  }
  if( (pTabItem->fg.jointype & JT_LTORJ)==0 ){
    mAll |= pLoop->maskSelf;
    for(k=0; k<pWC->nTerm; k++){
      WhereTerm *pTerm = &pWC->a[k];
      if( (pTerm->wtFlags & (TERM_VIRTUAL|TERM_SLICE))!=0
       && pTerm->eOperator!=WO_ROWVAL
      ){
        break;
      }
      if( pTerm->prereqAll & ~mAll ) continue;
      if( ExprHasProperty(pTerm->pExpr, EP_OuterON|EP_InnerON) ) continue;
      pSubWhere = sqlite3ExprAnd(pParse, pSubWhere,
                                 sqlite3ExprDup(pParse->db, pTerm->pExpr, 0));
    }
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  memcpy(&sFrom.a[0], pTabItem, sizeof(SrcItem));
  sFrom.a[0].fg.jointype = 0;
  assert( pParse->withinRJSubrtn < 100 );
  pParse->withinRJSubrtn++;
  pSubWInfo = sqlite3WhereBegin(pParse, &sFrom, pSubWhere, 0, 0, 0,
                                WHERE_RIGHT_JOIN, 0);
  if( pSubWInfo ){
    int iCur = pLevel->iTabCur;
    int r = ++pParse->nMem;
    int nPk;
    int jmp;
    int addrCont = sqlite3WhereContinueLabel(pSubWInfo);
    Table *pTab = pTabItem->pTab;
    if( HasRowid(pTab) ){
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, -1, r);
      nPk = 1;
    }else{
      int iPk;
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      nPk = pPk->nKeyCol;
      pParse->nMem += nPk - 1;
      for(iPk=0; iPk<nPk; iPk++){
        int iCol = pPk->aiColumn[iPk];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, iCol,r+iPk);
      }
    }
    jmp = sqlite3VdbeAddOp4Int(v, OP_Filter, pRJ->regBloom, 0, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeAddOp4Int(v, OP_Found, pRJ->iMatch, addrCont, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, jmp);
    sqlite3VdbeAddOp2(v, OP_Gosub, pRJ->regReturn, pRJ->addrSubrtn);
    sqlite3WhereEnd(pSubWInfo);
  }
  sqlite3ExprDelete(pParse->db, pSubWhere);
  ExplainQueryPlanPop(pParse);
  assert( pParse->withinRJSubrtn>0 );
  pParse->withinRJSubrtn--;
}